

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhash.h
# Opt level: O3

result_type __thiscall
beast::uhash<beast::spooky>::operator()
          (uhash<beast::spooky> *this,base_uint<160UL,_jbcoin::detail::AccountIDTag> *t)

{
  uint64_t h2;
  uint64_t h1;
  spooky h;
  uint64 local_150;
  result_type local_148;
  SpookyHash local_140;
  
  local_140.m_length = 0;
  local_140.m_remainder = '\0';
  local_140.m_state[0] = 1;
  local_140.m_state[1] = 2;
  SpookyHash::Update(&local_140,t,0x14);
  SpookyHash::Final(&local_140,&local_148,&local_150);
  return local_148;
}

Assistant:

result_type
    operator()(T const& t) const noexcept
    {
        Hasher h;
        hash_append (h, t);
        return static_cast<result_type>(h);
    }